

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::Fixed>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 Fixed min,Fixed max,float gridSize)

{
  bool bVar1;
  Fixed FVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  int local_128;
  int i_1;
  int i;
  Fixed local_e4;
  deInt32 local_e0;
  int local_dc;
  int local_d8;
  Fixed local_d4;
  deInt32 local_d0;
  deInt32 local_cc;
  deInt32 local_c8;
  Fixed local_c4;
  Fixed local_c0;
  deInt32 local_bc;
  int local_b8;
  int local_b4;
  Fixed local_b0;
  deInt32 local_ac;
  deInt32 local_a8;
  deInt32 local_a4;
  Fixed local_a0;
  Fixed local_9c;
  deInt32 local_98;
  int local_94;
  int local_90;
  Fixed local_8c;
  deInt32 local_88;
  int local_84;
  Fixed local_80;
  int attemptNdx;
  Fixed w;
  Fixed z;
  Fixed y2;
  Fixed y1;
  Fixed x2;
  Fixed x1;
  int quadNdx;
  Fixed local_5c;
  Fixed minDiff;
  Fixed minQuadSize;
  deRandom rnd;
  char *_data;
  char *resultData;
  int quadStride;
  int componentStride;
  float gridSize_local;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  Fixed max_local;
  Fixed min_local;
  
  seed_local = min.m_value;
  count_local = max.m_value;
  resultData._4_4_ = 0;
  gridSize_local = (float)stride;
  if (stride == 0) {
    gridSize_local = (float)(componentCount * 4);
  }
  if (primitive == PRIMITIVE_TRIANGLES) {
    resultData._4_4_ = (int)gridSize_local * 6;
  }
  pcVar3 = (char *)operator_new__((long)(offset + resultData._4_4_ * count));
  deRandom_init((deRandom *)&minDiff,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar4 = gls::GLValue::Fixed::to<float>((Fixed *)&count_local);
    fVar5 = gls::GLValue::Fixed::to<float>((Fixed *)&seed_local);
    fVar4 = deFloatAbs(fVar4 - fVar5);
    local_5c = gls::GLValue::Fixed::fromFloat(fVar4 * gridSize);
    x1 = minValue<deqp::gls::GLValue::Fixed>();
    bVar1 = gls::GLValue::Fixed::operator>(&x1,&local_5c);
    if (bVar1) {
      quadNdx = (int)minValue<deqp::gls::GLValue::Fixed>();
    }
    else {
      quadNdx = local_5c.m_value;
    }
    for (x2.m_value = 0; x2.m_value < count; x2.m_value = x2.m_value + 1) {
      for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
        local_90 = seed_local;
        local_94 = count_local;
        local_8c = getRandom<deqp::gls::GLValue::Fixed>
                             ((deRandom *)&minDiff,(Fixed)seed_local,(Fixed)count_local);
        local_88 = (deInt32)roundTo<deqp::gls::GLValue::Fixed>((Fixed *)&quadNdx,&local_8c);
        local_a0.m_value = quadNdx;
        y1.m_value = local_88;
        local_a8 = (deInt32)gls::GLValue::Fixed::operator-((Fixed *)&count_local,&y1);
        local_a4 = (deInt32)abs<deqp::gls::GLValue::Fixed>((Fixed)local_a8);
        local_9c = getRandom<deqp::gls::GLValue::Fixed>
                             ((deRandom *)&minDiff,local_a0,(Fixed)local_a4);
        local_98 = (deInt32)roundTo<deqp::gls::GLValue::Fixed>((Fixed *)&quadNdx,&local_9c);
        local_b4 = seed_local;
        local_b8 = count_local;
        y2.m_value = local_98;
        local_b0 = getRandom<deqp::gls::GLValue::Fixed>
                             ((deRandom *)&minDiff,(Fixed)seed_local,(Fixed)count_local);
        local_ac = (deInt32)roundTo<deqp::gls::GLValue::Fixed>((Fixed *)&quadNdx,&local_b0);
        local_c4.m_value = quadNdx;
        z.m_value = local_ac;
        local_cc = (deInt32)gls::GLValue::Fixed::operator-((Fixed *)&count_local,&z);
        local_c8 = (deInt32)abs<deqp::gls::GLValue::Fixed>((Fixed)local_cc);
        local_c0 = getRandom<deqp::gls::GLValue::Fixed>
                             ((deRandom *)&minDiff,local_c4,(Fixed)local_c8);
        local_bc = (deInt32)roundTo<deqp::gls::GLValue::Fixed>((Fixed *)&quadNdx,&local_c0);
        w = (Fixed)local_bc;
        if (componentCount < 3) {
          local_d0 = (deInt32)gls::GLValue::Fixed::create(0);
        }
        else {
          local_d8 = seed_local;
          local_dc = count_local;
          local_d4 = getRandom<deqp::gls::GLValue::Fixed>
                               ((deRandom *)&minDiff,(Fixed)seed_local,(Fixed)count_local);
          local_d0 = (deInt32)roundTo<deqp::gls::GLValue::Fixed>((Fixed *)&quadNdx,&local_d4);
        }
        attemptNdx = local_d0;
        if (componentCount < 4) {
          local_e0 = (deInt32)gls::GLValue::Fixed::create(1);
        }
        else {
          local_e4 = getRandom<deqp::gls::GLValue::Fixed>
                               ((deRandom *)&minDiff,(Fixed)seed_local,(Fixed)count_local);
          local_e0 = (deInt32)roundTo<deqp::gls::GLValue::Fixed>((Fixed *)&quadNdx,&local_e4);
        }
        local_80.m_value = local_e0;
        if (componentCount < 3) break;
        fVar4 = gls::GLValue::Fixed::to<float>(&y2);
        fVar5 = gls::GLValue::Fixed::to<float>((Fixed *)&attemptNdx);
        fVar4 = deFloatAbs(fVar4 + fVar5);
        fVar5 = gls::GLValue::Fixed::to<float>((Fixed *)&quadNdx);
        if (fVar5 <= fVar4) {
          fVar4 = gls::GLValue::Fixed::to<float>(&w);
          fVar5 = gls::GLValue::Fixed::to<float>(&local_80);
          fVar4 = deFloatAbs(fVar4 + fVar5);
          fVar5 = gls::GLValue::Fixed::to<float>((Fixed *)&quadNdx);
          if (fVar5 <= fVar4) break;
        }
      }
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_) + (long)offset,y1);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + 4) + (long)offset,z);
      FVar2 = gls::GLValue::Fixed::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local) + (long)offset
                 ,FVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local + 4) +
                          (long)offset,z);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 2) +
                          (long)offset,y1);
      FVar2 = gls::GLValue::Fixed::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 2 + 4) +
                          (long)offset,FVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 3) +
                          (long)offset,y1);
      FVar2 = gls::GLValue::Fixed::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 3 + 4) +
                          (long)offset,FVar2);
      FVar2 = gls::GLValue::Fixed::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 4) +
                          (long)offset,FVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 4 + 4) +
                          (long)offset,z);
      FVar2 = gls::GLValue::Fixed::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 5) +
                          (long)offset,FVar2);
      FVar2 = gls::GLValue::Fixed::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 5 + 4) +
                          (long)offset,FVar2);
      if (2 < componentCount) {
        for (i_1 = 0; i_1 < 6; i_1 = i_1 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                    (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * i_1 + 8)
                              + (long)offset,(Fixed)attemptNdx);
        }
      }
      if (3 < componentCount) {
        for (local_128 = 0; local_128 < 6; local_128 = local_128 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::Fixed>
                    (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * local_128
                                    + 0xc) + (long)offset,local_80);
        }
      }
    }
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}